

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O0

void av1_free_pmc(PICK_MODE_CONTEXT *ctx,int num_planes)

{
  int in_ESI;
  long in_RDI;
  int i_1;
  int i;
  undefined4 local_14;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  if (in_RDI != 0) {
    aom_free((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    *(undefined8 *)(in_RDI + 0x118) = 0;
    aom_free((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      *(undefined8 *)(in_RDI + 0x120 + (long)iVar1 * 8) = 0;
      *(undefined8 *)(in_RDI + 0x138 + (long)iVar1 * 8) = 0;
      *(undefined8 *)(in_RDI + 0x150 + (long)iVar1 * 8) = 0;
      aom_free((void *)CONCAT44(in_ESI,iVar1));
      *(undefined8 *)(in_RDI + 0x168 + (long)iVar1 * 8) = 0;
      aom_free((void *)CONCAT44(in_ESI,iVar1));
      *(undefined8 *)(in_RDI + 0x180 + (long)iVar1 * 8) = 0;
    }
    for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
      if (*(long *)(in_RDI + 0x108 + (long)local_14 * 8) != 0) {
        aom_free((void *)CONCAT44(in_ESI,iVar1));
        *(undefined8 *)(in_RDI + 0x108 + (long)local_14 * 8) = 0;
      }
    }
    aom_free((void *)CONCAT44(in_ESI,iVar1));
  }
  return;
}

Assistant:

void av1_free_pmc(PICK_MODE_CONTEXT *ctx, int num_planes) {
  if (ctx == NULL) return;

  aom_free(ctx->blk_skip);
  ctx->blk_skip = NULL;
  aom_free(ctx->tx_type_map);
  for (int i = 0; i < num_planes; ++i) {
    ctx->coeff[i] = NULL;
    ctx->qcoeff[i] = NULL;
    ctx->dqcoeff[i] = NULL;
    aom_free(ctx->eobs[i]);
    ctx->eobs[i] = NULL;
    aom_free(ctx->txb_entropy_ctx[i]);
    ctx->txb_entropy_ctx[i] = NULL;
  }

  for (int i = 0; i < 2; ++i) {
    if (ctx->color_index_map[i]) {
      aom_free(ctx->color_index_map[i]);
      ctx->color_index_map[i] = NULL;
    }
  }

  aom_free(ctx);
}